

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaLf.c
# Opt level: O2

int Lf_ObjCoArrival2_rec(Lf_Man_t *p,Gia_Obj_t *pDriver)

{
  int iVar1;
  uint uVar2;
  Lf_Bst_t *p_00;
  
  while( true ) {
    iVar1 = Gia_ObjIsBuf(pDriver);
    uVar2 = (uint)*(undefined8 *)pDriver;
    if (iVar1 == 0) break;
    pDriver = pDriver + -(ulong)(uVar2 & 0x1fffffff);
  }
  if ((~uVar2 & 0x1fffffff) == 0 || (int)uVar2 < 0) {
    iVar1 = 0;
    if ((~uVar2 & 0x9fffffff) == 0) {
      iVar1 = Gia_ObjCioId(pDriver);
      iVar1 = Vec_IntEntry(&p->vCiArrivals,iVar1);
      return iVar1;
    }
  }
  else {
    iVar1 = Gia_ObjId(p->pGia,pDriver);
    p_00 = Lf_ObjReadBest(p,iVar1);
    uVar2 = Lf_BestCutIndex(p_00);
    if (1 < uVar2) {
      iVar1 = Gia_ObjIsMux(p->pGia,pDriver);
      if (iVar1 == 0) {
        __assert_fail("Index < 2 || Gia_ObjIsMux(p->pGia, pDriver)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaLf.c"
                      ,0xbf,"int Lf_ObjCoArrival2_rec(Lf_Man_t *, Gia_Obj_t *)");
      }
    }
    iVar1 = p_00->Delay[uVar2];
  }
  return iVar1;
}

Assistant:

int Lf_ObjCoArrival2_rec( Lf_Man_t * p, Gia_Obj_t * pDriver )
{
    if ( Gia_ObjIsBuf(pDriver) )
        return Lf_ObjCoArrival2_rec( p, Gia_ObjFanin0(pDriver) );
    if ( Gia_ObjIsAnd(pDriver) )
    {
        Lf_Bst_t * pBest = Lf_ObjReadBest(p, Gia_ObjId(p->pGia, pDriver));
        int Index = Lf_BestCutIndex( pBest );
        assert( Index < 2 || Gia_ObjIsMux(p->pGia, pDriver) );
        return pBest->Delay[Index];
    }
    if ( Gia_ObjIsCi(pDriver) )
        return Lf_ObjCiArrival(p, Gia_ObjCioId(pDriver));
    return 0;
}